

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O0

Store * __thiscall
wasm::Builder::makeStore
          (Builder *this,uint bytes,Address offset,uint align,Expression *ptr,Expression *value,
          Type type,Name memory)

{
  bool bVar1;
  Store *pSVar2;
  bool local_49;
  Store *ret;
  Expression *value_local;
  Expression *ptr_local;
  uint align_local;
  uint bytes_local;
  Builder *this_local;
  Type type_local;
  Address offset_local;
  
  this_local = (Builder *)type.id;
  type_local.id = offset.addr;
  pSVar2 = MixedArena::alloc<wasm::Store>(&this->wasm->allocator);
  pSVar2->isAtomic = false;
  pSVar2->bytes = (uint8_t)bytes;
  (pSVar2->offset).addr = type_local.id;
  Address::operator=(&pSVar2->align,(ulong)align);
  pSVar2->ptr = ptr;
  pSVar2->value = value;
  (pSVar2->valueType).id = (uintptr_t)this_local;
  Name::operator=(&pSVar2->memory,&memory);
  ::wasm::Store::finalize();
  bVar1 = Type::isConcrete(&pSVar2->value->type);
  if (bVar1) {
    local_49 = Type::operator==(&pSVar2->value->type,(Type *)&this_local);
  }
  else {
    local_49 = true;
  }
  if (local_49 == false) {
    __assert_fail("ret->value->type.isConcrete() ? ret->value->type == type : true",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-builder.h"
                  ,0x1b8,
                  "Store *wasm::Builder::makeStore(unsigned int, Address, unsigned int, Expression *, Expression *, Type, Name)"
                 );
  }
  return pSVar2;
}

Assistant:

Store* makeStore(unsigned bytes,
                   Address offset,
                   unsigned align,
                   Expression* ptr,
                   Expression* value,
                   Type type,
                   Name memory) {
    auto* ret = wasm.allocator.alloc<Store>();
    ret->isAtomic = false;
    ret->bytes = bytes;
    ret->offset = offset;
    ret->align = align;
    ret->ptr = ptr;
    ret->value = value;
    ret->valueType = type;
    ret->memory = memory;
    ret->finalize();
    assert(ret->value->type.isConcrete() ? ret->value->type == type : true);
    return ret;
  }